

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_err_t aom_codec_enc_config_set(aom_codec_ctx_t *ctx,aom_codec_enc_cfg_t *cfg)

{
  aom_codec_enc_config_set_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  aom_codec_enc_cfg_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_codec_err_t res;
  aom_codec_err_t local_14;
  
  if ((((in_RDI == (aom_codec_ctx_t *)0x0) || (in_RDI->iface == (aom_codec_iface_t *)0x0)) ||
      (in_RDI->priv == (aom_codec_priv_t *)0x0)) || (in_RSI == (aom_codec_enc_cfg_t *)0x0)) {
    local_14 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI->iface->caps & 2U) == 0) {
    local_14 = AOM_CODEC_INCAPABLE;
  }
  else {
    p_Var1 = (in_RDI->iface->enc).cfg_set;
    paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
    local_14 = (*p_Var1)(paVar2,in_RSI);
  }
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    in_RDI->err = local_14;
  }
  return local_14;
}

Assistant:

aom_codec_err_t aom_codec_enc_config_set(aom_codec_ctx_t *ctx,
                                         const aom_codec_enc_cfg_t *cfg) {
  aom_codec_err_t res;

  if (!ctx || !ctx->iface || !ctx->priv || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else
    res = ctx->iface->enc.cfg_set(get_alg_priv(ctx), cfg);

  return SAVE_STATUS(ctx, res);
}